

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O1

ByteData * __thiscall
cfd::core::ByteData256::Serialize(ByteData *__return_storage_ptr__,ByteData256 *this)

{
  uint8_t *buffer;
  Serializer obj;
  allocator_type local_49;
  undefined1 local_48 [8];
  uint8_t *local_40;
  uint32_t local_28;
  
  local_48 = (undefined1  [8])&PTR__Serializer_007405b8;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,
             (ulong)((*(int *)&(this->data_).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                     *(int *)&(this->data_).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start) + 9),&local_49);
  local_28 = 0;
  buffer = (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  Serializer::AddVariableBuffer
            ((Serializer *)local_48,buffer,
             *(int *)&(this->data_).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (int)buffer);
  ByteData::ByteData(__return_storage_ptr__,local_40,local_28);
  local_48 = (undefined1  [8])&PTR__Serializer_007405b8;
  if (local_40 != (uint8_t *)0x0) {
    operator_delete(local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData ByteData256::Serialize() const {
  Serializer obj(static_cast<uint32_t>(data_.size()));
  obj.AddVariableBuffer(data_.data(), static_cast<uint32_t>(data_.size()));
  return obj.Output();
}